

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O1

Address * __thiscall
cfd::AddressFactory::GetAddressByHash
          (Address *__return_storage_ptr__,AddressFactory *this,AddressType address_type,
          ByteData *hash)

{
  ByteData160 local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  core::ByteData::GetBytes(&local_38,hash);
  core::ByteData160::ByteData160(&local_50,&local_38);
  core::Address::Address
            (__return_storage_ptr__,this->type_,address_type,&local_50,&this->prefix_list_);
  if (local_50.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Address AddressFactory::GetAddressByHash(
    AddressType address_type, const ByteData& hash) const {
  return GetAddressByHash(address_type, ByteData160(hash.GetBytes()));
}